

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_WriteObjectRec(BCWriterState *s,JSValue obj)

{
  ushort *puVar1;
  byte bVar2;
  short sVar3;
  uint uVar4;
  JSAtom v;
  JSMapRecord *pJVar5;
  long lVar6;
  void *__src;
  JSRuntime *pJVar7;
  BCWriterState *s_00;
  int pos;
  int iVar8;
  JSAtomKindEnum JVar9;
  int iVar10;
  uint8_t *puVar11;
  uint32_t *puVar12;
  ulong uVar13;
  JSObjectListEntry *pJVar14;
  uint uVar15;
  uint8_t uVar16;
  JSString *p;
  uintptr_t sp;
  uint uVar17;
  JSValueUnion JVar18;
  char *fmt;
  uint uVar19;
  JSContext *pJVar20;
  uint32_t idx;
  BCWriterState *pBVar21;
  DynBuf *pDVar22;
  long lVar23;
  JSValueUnion JVar24;
  long lVar25;
  JSValueUnion JVar26;
  JSValue obj_00;
  JSValue obj_01;
  JSValue v_00;
  JSValue obj_02;
  JSValue JVar27;
  JSValue JVar28;
  JSValue obj_03;
  JSValue this_obj;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t val;
  uint uStack_54;
  JSValueUnion local_50;
  uint32_t local_44;
  JSValueUnion local_40;
  BCWriterState *local_38;
  
  JVar28.tag = obj.tag;
  JVar18 = obj.u;
  pJVar20 = s->ctx;
  if (&stack0xfffffffffffffff8 < (undefined1 *)pJVar20->rt->stack_limit) {
    JS_ThrowStackOverflow(pJVar20);
    return -1;
  }
  local_40 = JVar18;
  local_38 = s;
  switch((int)obj.tag) {
  case 0:
    dbuf_putc(&s->dbuf,'\x05');
    dbuf_put_sleb128(&s->dbuf,obj.u._0_4_);
    return 0;
  case 1:
    uVar16 = obj.u._0_1_ + '\x03';
    break;
  case 2:
    uVar16 = '\x01';
    break;
  case 3:
    uVar16 = '\x02';
    break;
  case 7:
    dbuf_putc(&s->dbuf,'\x06');
    bc_put_u64(s,(uint64_t)JVar18);
    return 0;
  case -7:
    dbuf_putc(&s->dbuf,'\a');
    JS_WriteString(s,(JSString *)JVar18.ptr);
    return 0;
  default:
    goto switchD_001259a6_caseD_fffffffa;
  case -3:
    if (s->field_0x39 == '\0') goto switchD_001259a6_caseD_fffffffa;
    pDVar22 = &s->dbuf;
    dbuf_putc(pDVar22,'\x0f');
    bc_put_atom(s,*(JSAtom *)((long)JVar18.ptr + 4));
    dbuf_put_leb128(pDVar22,(((JSString *)((long)JVar18.ptr + 0x20))->header).ref_count);
    lVar23 = 0;
    for (lVar25 = 0; lVar25 < (((JSString *)((long)JVar18.ptr + 0x20))->header).ref_count;
        lVar25 = lVar25 + 1) {
      bc_put_atom(s,*(JSAtom *)
                     ((long)&((*(JSShape **)((long)JVar18.ptr + 0x18))->header).ref_count + lVar23))
      ;
      lVar23 = lVar23 + 0x10;
    }
    dbuf_put_leb128(pDVar22,(((JSString *)((long)JVar18.ptr + 0x30))->header).ref_count);
    lVar25 = 0x18;
    for (lVar23 = 0; lVar23 < (((JSString *)((long)JVar18.ptr + 0x30))->header).ref_count;
        lVar23 = lVar23 + 1) {
      pJVar5 = *(JSMapRecord **)((long)JVar18.ptr + 0x28);
      dbuf_putc(pDVar22,*(uint8_t *)((long)pJVar5 + lVar25 + -8));
      iVar10 = *(int *)((long)pJVar5 + lVar25 + -8);
      dbuf_put_leb128(pDVar22,*(uint32_t *)((long)pJVar5 + lVar25 + -0x18));
      pBVar21 = local_38;
      if (iVar10 != 0) {
        bc_put_atom(local_38,*(JSAtom *)((long)pJVar5 + lVar25 + -4));
      }
      bc_put_atom(pBVar21,*(JSAtom *)((long)&pJVar5->ref_count + lVar25));
      lVar25 = lVar25 + 0x20;
      JVar18 = local_40;
    }
    dbuf_put_leb128(pDVar22,(((JSString *)((long)JVar18.ptr + 0x40))->header).ref_count);
    for (lVar25 = 0; lVar25 < (((JSString *)((long)JVar18.ptr + 0x40))->header).ref_count;
        lVar25 = lVar25 + 1) {
      dbuf_put_leb128(pDVar22,*(uint32_t *)(*(long *)((long)JVar18.ptr + 0x38) + lVar25 * 4));
    }
    dbuf_put_leb128(pDVar22,(((JSString *)((long)JVar18.ptr + 0x50))->header).ref_count);
    lVar25 = 8;
    for (lVar23 = 0; lVar23 < (((JSString *)((long)JVar18.ptr + 0x50))->header).ref_count;
        lVar23 = lVar23 + 1) {
      lVar6 = *(long *)&((JSObject *)((long)local_40.ptr + 0x48))->field_0;
      dbuf_put_leb128(pDVar22,*(uint32_t *)(lVar6 + -8 + lVar25));
      bc_put_atom(local_38,*(JSAtom *)(lVar6 + -4 + lVar25));
      JVar18 = local_40;
      dbuf_put_leb128(pDVar22,*(uint32_t *)(lVar6 + lVar25));
      lVar25 = lVar25 + 0xc;
    }
    iVar10 = JS_WriteObjectRec(local_38,*(JSValue *)((long)JVar18.ptr + 0x68));
    goto LAB_00126332;
  case -2:
    if (s->field_0x39 != '\0') {
      pDVar22 = &s->dbuf;
      dbuf_putc(pDVar22,'\x0e');
      bc_put_u16(s,*(ushort *)((long)JVar18.ptr + 0x19) & 0xfff);
      dbuf_putc(pDVar22,*(uint8_t *)((long)JVar18.ptr + 0x18));
      bc_put_atom(s,*(uint32_t *)((long)JVar18.ptr + 0x2c));
      dbuf_put_leb128(pDVar22,(uint)(ushort)(((JSString *)((long)JVar18.ptr + 0x40))->header).
                                            ref_count);
      dbuf_put_leb128(pDVar22,(uint)*(ushort *)((long)JVar18.ptr + 0x42));
      dbuf_put_leb128(pDVar22,(uint)*(ushort *)((long)JVar18.ptr + 0x44));
      dbuf_put_leb128(pDVar22,(uint)*(ushort *)((long)JVar18.ptr + 0x46));
      dbuf_put_leb128(pDVar22,*(uint32_t *)((long)JVar18.ptr + 0x5c));
      dbuf_put_leb128(pDVar22,*(uint32_t *)((long)JVar18.ptr + 0x58));
      dbuf_put_leb128(pDVar22,*(uint32_t *)((long)JVar18.ptr + 0x28));
      if (*(long *)((long)JVar18.ptr + 0x30) == 0) {
        dbuf_put_leb128(pDVar22,0);
      }
      else {
        dbuf_put_leb128(pDVar22,(uint)*(ushort *)((long)JVar18.ptr + 0x42) +
                                (uint)(ushort)(((JSString *)((long)JVar18.ptr + 0x40))->header).
                                              ref_count);
        lVar25 = 0xc;
        for (uVar13 = 0;
            uVar13 < (ulong)*(ushort *)((long)JVar18.ptr + 0x42) +
                     (ulong)(ushort)(((JSString *)((long)JVar18.ptr + 0x40))->header).ref_count;
            uVar13 = uVar13 + 1) {
          lVar23 = *(long *)((long)JVar18.ptr + 0x30);
          bc_put_atom(local_38,*(JSAtom *)(lVar23 + -0xc + lVar25));
          dbuf_put_leb128(pDVar22,*(uint32_t *)(lVar23 + -8 + lVar25));
          dbuf_put_leb128(pDVar22,*(int *)(lVar23 + -4 + lVar25) + 1);
          dbuf_putc(pDVar22,(byte)((*(uint *)(lVar23 + lVar25) & 7) << 4) |
                            (byte)(*(uint *)(lVar23 + lVar25) >> 3) & 0xf);
          lVar25 = lVar25 + 0x10;
        }
      }
      pBVar21 = local_38;
      for (lVar25 = 0; lVar25 < (int)*(uint32_t *)((long)JVar18.ptr + 0x5c); lVar25 = lVar25 + 1) {
        lVar23 = *(long *)((long)JVar18.ptr + 0x38);
        bc_put_atom(pBVar21,*(JSAtom *)(lVar23 + 4 + lVar25 * 8));
        dbuf_put_leb128(pDVar22,(uint)*(ushort *)(lVar23 + 2 + lVar25 * 8));
        dbuf_putc(pDVar22,*(uint8_t *)(lVar23 + lVar25 * 8));
      }
      __src = *(void **)((long)JVar18.ptr + 0x20);
      JVar24 = (JSValueUnion)(long)*(int *)((long)JVar18.ptr + 0x28);
      puVar11 = (uint8_t *)js_malloc(pBVar21->ctx,(size_t)JVar24);
      if (puVar11 == (uint8_t *)0x0) {
        return -1;
      }
      memcpy(puVar11,__src,(size_t)JVar24);
      local_50 = (JSValueUnion)pDVar22;
      local_40 = JVar24;
      for (uVar17 = 0; (int)uVar17 < SUB84(JVar24,0); uVar17 = uVar17 + bVar2) {
        bVar2 = puVar11[uVar17];
        uVar19 = bVar2 + 0xf;
        if (bVar2 < 0xb2) {
          uVar19 = (uint)bVar2;
        }
        bVar2 = opcode_info[uVar19].size;
        if ((byte)(opcode_info[uVar19].fmt - 0x17) < 5) {
          iVar10 = bc_atom_to_idx(local_38,&local_60,*(JSAtom *)(puVar11 + (ulong)uVar17 + 1));
          if (iVar10 != 0) goto LAB_00125fc2;
          *(uint32_t *)(puVar11 + (ulong)uVar17 + 1) = local_60;
          JVar24 = local_40;
        }
        pBVar21 = local_38;
      }
      if (pBVar21->field_0x38 != '\0') {
        for (uVar19 = 0; (int)uVar19 < SUB84(JVar24,0); uVar19 = uVar19 + bVar2) {
          bVar2 = puVar11[uVar19];
          uVar15 = bVar2 + 0xf;
          if (bVar2 < 0xb2) {
            uVar15 = (uint)bVar2;
          }
          bVar2 = opcode_info[uVar15].size;
          uVar16 = opcode_info[uVar15].fmt;
          switch(uVar16) {
          case '\n':
          case '\v':
          case '\f':
          case '\r':
          case '\x10':
          case '\x11':
          case '\x12':
            puVar1 = (ushort *)(puVar11 + (ulong)uVar19 + 1);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            break;
          case '\x0f':
            puVar1 = (ushort *)(puVar11 + (ulong)uVar19 + 1);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar1 = (ushort *)(puVar11 + (ulong)uVar19 + 3);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            break;
          case '\x13':
          case '\x14':
          case '\x15':
          case '\x16':
          case '\x17':
          case '\x18':
            uVar15 = *(uint *)(puVar11 + (ulong)uVar19 + 1);
            *(uint *)(puVar11 + (ulong)uVar19 + 1) =
                 uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
            ;
            break;
          case '\x19':
          case '\x1c':
            uVar15 = *(uint *)(puVar11 + (ulong)uVar19 + 1);
            *(uint *)(puVar11 + (ulong)uVar19 + 1) =
                 uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
            ;
            puVar1 = (ushort *)(puVar11 + (ulong)uVar19 + 5);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            break;
          case '\x1a':
          case '\x1b':
            uVar15 = *(uint *)(puVar11 + (ulong)uVar19 + 1);
            uVar4 = *(uint *)(puVar11 + (ulong)uVar19 + 5);
            *(uint *)(puVar11 + (ulong)uVar19 + 1) =
                 uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
            ;
            *(uint *)(puVar11 + (ulong)uVar19 + 5) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
            if (uVar16 == '\x1b') {
              puVar1 = (ushort *)(puVar11 + (ulong)uVar19 + 9);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
          }
        }
      }
      dbuf_put((DynBuf *)local_50,puVar11,(size_t)JVar24);
LAB_00125fc2:
      pJVar7 = local_38->ctx->rt;
      (*(pJVar7->mf).js_free)(&pJVar7->malloc_state,puVar11);
      if ((int)uVar17 < (int)local_40._0_4_) {
        return -1;
      }
      if ((*(byte *)((long)JVar18.ptr + 0x1a) & 4) != 0) {
        bc_put_atom(local_38,(((JSString *)((long)JVar18.ptr + 0x60))->header).ref_count);
        JVar24 = local_50;
        dbuf_put_leb128((DynBuf *)local_50,*(uint32_t *)((long)JVar18.ptr + 100));
        dbuf_put_leb128((DynBuf *)JVar24,*(uint32_t *)((long)JVar18.ptr + 0x6c));
        dbuf_put((DynBuf *)JVar24,*(uint8_t **)((long)JVar18.ptr + 0x70),
                 (long)(int)*(uint32_t *)((long)JVar18.ptr + 0x6c));
      }
      lVar25 = -1;
      lVar23 = 8;
      do {
        lVar25 = lVar25 + 1;
        if (*(int *)((long)JVar18.ptr + 0x58) <= lVar25) {
          return 0;
        }
        obj_00.tag = *(int64_t *)(*(long *)((long)JVar18.ptr + 0x50) + lVar23);
        obj_00.u.ptr = ((JSValueUnion *)(*(long *)((long)JVar18.ptr + 0x50) + -8 + lVar23))->ptr;
        iVar10 = JS_WriteObjectRec(local_38,obj_00);
        lVar23 = lVar23 + 0x10;
      } while (iVar10 == 0);
      return -1;
    }
    goto switchD_001259a6_caseD_fffffffa;
  case -1:
    if (*(uint *)&s->field_0x38 < 0x1000000) {
      if ((*(byte *)((long)JVar18.ptr + 5) & 0x40) != 0) {
        JS_ThrowTypeError(pJVar20,"circular reference");
        return -1;
      }
      *(byte *)((long)JVar18.ptr + 5) = *(byte *)((long)JVar18.ptr + 5) | 0x40;
    }
    else {
      iVar10 = (s->object_list).object_count;
      if (iVar10 != 0) {
        puVar12 = (s->object_list).hash_table +
                  (obj.u._0_4_ * 0xc5b & (s->object_list).hash_size - 1);
        do {
          uVar17 = *puVar12;
          if ((ulong)uVar17 == 0xffffffff) goto LAB_00125d42;
          pJVar14 = (s->object_list).object_tab + uVar17;
          puVar12 = &pJVar14->hash_next;
        } while (pJVar14->obj != (JSObject *)JVar18.ptr);
        if (-1 < (int)uVar17) {
          dbuf_putc(&s->dbuf,'\x15');
          dbuf_put_leb128(&s->dbuf,uVar17);
          return 0;
        }
      }
LAB_00125d42:
      iVar10 = js_resize_array(pJVar20,&(s->object_list).object_tab,0x10,
                               &(s->object_list).object_size,iVar10 + 1);
      if (iVar10 != 0) {
        return -1;
      }
      uVar17 = (local_38->object_list).object_count;
      uVar19 = (local_38->object_list).hash_size;
      uVar15 = uVar17 + 1;
      if (uVar15 < uVar19) {
        puVar12 = (local_38->object_list).hash_table;
      }
      else {
        lVar25 = 8;
        JVar18.float64 = 1.97626258336499e-323;
        if (4 < uVar19) {
          JVar18._4_4_ = 0;
          JVar18.int32 = uVar19;
        }
        do {
          local_50 = JVar18;
          JVar18._4_4_ = 0;
          JVar18.int32 = local_50.int32 * 2;
        } while ((uint)local_50.int32 <= uVar17);
        puVar12 = (uint32_t *)js_malloc(pJVar20,(long)local_50.ptr << 2);
        pBVar21 = local_38;
        if (puVar12 == (uint32_t *)0x0) {
          return -1;
        }
        (*(pJVar20->rt->mf).js_free)(&pJVar20->rt->malloc_state,(local_38->object_list).hash_table);
        (pBVar21->object_list).hash_table = puVar12;
        (pBVar21->object_list).hash_size = local_50.int32;
        JVar24 = local_50;
        for (uVar13 = 0; uVar13 < ((ulong)JVar24.ptr & 0xffffffff); uVar13 = uVar13 + 1) {
          puVar12[uVar13] = 0xffffffff;
          JVar24._4_4_ = 0;
          JVar24.int32 = (local_38->object_list).hash_size;
        }
        for (uVar13 = 0; uVar17 = (local_38->object_list).object_count, uVar13 < uVar17;
            uVar13 = uVar13 + 1) {
          pJVar14 = (local_38->object_list).object_tab;
          uVar17 = *(int *)((long)pJVar14 + lVar25 + -8) * 0xc5b &
                   (local_38->object_list).hash_size - 1;
          *(uint32_t *)((long)&pJVar14->obj + lVar25) = puVar12[uVar17];
          puVar12[uVar17] = (uint32_t)uVar13;
          lVar25 = lVar25 + 0x10;
        }
        uVar19 = (local_38->object_list).hash_size;
        uVar15 = uVar17 + 1;
        JVar18 = local_40;
      }
      pJVar14 = (local_38->object_list).object_tab;
      (local_38->object_list).object_count = uVar15;
      uVar19 = JVar18.int32 * 0xc5b & uVar19 - 1;
      *(JSValueUnion *)&((JSValueUnion *)(pJVar14 + (int)uVar17))->int32 = JVar18;
      pJVar14[(int)uVar17].hash_next = puVar12[uVar19];
      puVar12[uVar19] = uVar17;
    }
    pBVar21 = local_38;
    sVar3 = *(short *)((long)JVar18.ptr + 6);
    switch(sVar3) {
    case 1:
      _val = &local_38->dbuf;
      dbuf_putc(_val,'\b');
      JVar24 = (JSValueUnion)((JSValueUnion *)((long)JVar18.ptr + 0x18))->ptr;
      JVar26.float64 = 0.0;
      local_44 = 0;
      local_50 = JVar24;
      do {
        if (JVar26.int32 == 1) {
          dbuf_put_leb128(_val,local_44);
        }
        else if (JVar26.int32 == 2) goto LAB_00126374;
        lVar25 = 8;
        local_40 = JVar26;
        for (uVar13 = 0; uVar13 < (uint)*(int *)((long)JVar24.ptr + 0x28); uVar13 = uVar13 + 1) {
          v = *(JSAtom *)((long)JVar24.ptr + uVar13 * 8 + 0x44);
          if (((v != 0) &&
              (JVar9 = JS_AtomGetKind(local_38->ctx,v), pBVar21 = local_38,
              JVar9 == JS_ATOM_KIND_STRING)) &&
             (uVar17 = *(uint *)((long)JVar24.ptr + uVar13 * 8 + 0x40), (uVar17 >> 0x1c & 1) != 0))
          {
            if (0x3fffffff < uVar17) {
              pJVar20 = local_38->ctx;
              fmt = "only value properties are supported";
              goto LAB_00126324;
            }
            if (local_40._0_4_ == 0) {
              local_44 = local_44 + 1;
            }
            else {
              bc_put_atom(local_38,v);
              JVar24 = local_50;
              obj_01.tag = *(int64_t *)(*(long *)((long)JVar18.ptr + 0x20) + lVar25);
              obj_01.u.ptr = ((JSValueUnion *)(*(long *)((long)JVar18.ptr + 0x20) + -8 + lVar25))->
                             ptr;
              iVar10 = JS_WriteObjectRec(pBVar21,obj_01);
              if (iVar10 != 0) goto LAB_0012632b;
            }
          }
          lVar25 = lVar25 + 0x10;
        }
        JVar26._0_4_ = local_40.int32 + 1;
        JVar26._4_4_ = 0;
      } while( true );
    case 2:
      if ((local_38->field_0x39 == '\0') || ((*(byte *)((long)JVar18.ptr + 5) & 1) != 0)) {
        _val = (DynBuf *)CONCAT44(uStack_54,(int)CONCAT71((uint7)(byte)((ushort)sVar3 >> 8),1));
        uVar16 = '\t';
      }
      else {
        uVar16 = '\r';
        _val = (DynBuf *)((ulong)uStack_54 << 0x20);
      }
      pDVar22 = &local_38->dbuf;
      dbuf_putc(pDVar22,uVar16);
      obj_03.tag = JVar28.tag;
      obj_03.u.float64 = JVar18.float64;
      iVar10 = js_get_length32(pBVar21->ctx,&local_5c,obj_03);
      if (iVar10 == 0) {
        local_44 = local_5c;
        dbuf_put_leb128(pDVar22,local_5c);
        pBVar21 = local_38;
        idx = 0;
        do {
          s_00 = local_38;
          if (local_44 == idx) {
            iVar10 = 0;
            if ((char)val != '\0') goto LAB_0012632e;
            obj_02.tag = JVar28.tag;
            obj_02.u.float64 = JVar18.float64;
            this_obj.tag = JVar28.tag;
            this_obj.u.float64 = JVar18.float64;
            JVar28 = JS_GetPropertyInternal(local_38->ctx,obj_02,0x70,this_obj,0);
            if ((int)JVar28.tag != 6) {
              iVar8 = JS_WriteObjectRec(s_00,JVar28);
              JS_FreeValue(s_00->ctx,JVar28);
              iVar10 = 0;
              if (iVar8 == 0) goto LAB_0012632e;
            }
            break;
          }
          JVar28.u.float64 = JVar18.float64;
          JVar27 = JS_GetPropertyUint32(pBVar21->ctx,JVar28,idx);
          v_00.tag = JVar27.tag;
          local_50 = JVar27.u;
          if ((int)JVar27.tag == 6) break;
          iVar10 = JS_WriteObjectRec(pBVar21,JVar27);
          local_40.int32 = iVar10;
          v_00.u.float64 = local_50.float64;
          JS_FreeValue(pBVar21->ctx,v_00);
          idx = idx + 1;
        } while (local_40._0_4_ == 0);
      }
LAB_0012632b:
      iVar10 = -1;
      break;
    default:
      if (8 < (ushort)(sVar3 - 0x15U)) {
        pJVar20 = local_38->ctx;
        fmt = "unsupported object class";
LAB_00126324:
        JS_ThrowTypeError(pJVar20,fmt);
        goto LAB_0012632b;
      }
      lVar25 = *(long *)((long)JVar18.ptr + 0x30);
      pDVar22 = &local_38->dbuf;
      dbuf_putc(pDVar22,'\x10');
      dbuf_putc(pDVar22,*(char *)((long)JVar18.ptr + 6) + 0xeb);
      dbuf_put_leb128(pDVar22,(((JSString *)((long)JVar18.ptr + 0x40))->header).ref_count);
      dbuf_put_leb128(pDVar22,*(uint32_t *)(lVar25 + 0x20));
      JVar27.tag = -1;
      JVar27.u.ptr = ((JSValueUnion *)(lVar25 + 0x18))->ptr;
      iVar10 = JS_WriteObjectRec(pBVar21,JVar27);
      iVar10 = -(uint)(iVar10 != 0);
      break;
    case 4:
    case 5:
    case 6:
      uVar16 = '\x14';
      goto LAB_00126060;
    case 10:
      uVar16 = '\x13';
LAB_00126060:
      dbuf_putc(&local_38->dbuf,uVar16);
      iVar10 = JS_WriteObjectRec(pBVar21,(JSValue)*(JSString *)((long)JVar18.ptr + 0x30));
      break;
    case 0x13:
      puVar12 = *(uint32_t **)((long)JVar18.ptr + 0x30);
      if ((char)puVar12[1] != '\0') {
        JS_ThrowTypeErrorDetachedArrayBuffer(local_38->ctx);
        goto LAB_0012632b;
      }
      pDVar22 = &local_38->dbuf;
      dbuf_putc(pDVar22,'\x11');
      dbuf_put_leb128(pDVar22,*puVar12);
      dbuf_put(pDVar22,*(uint8_t **)(puVar12 + 2),(long)(int)*puVar12);
LAB_00126374:
      iVar10 = 0;
      break;
    case 0x14:
      if (local_38->field_0x3a == '\0') {
        pJVar20 = local_38->ctx;
        goto switchD_001259a6_caseD_fffffffa;
      }
      puVar12 = *(uint32_t **)((long)JVar18.ptr + 0x30);
      pDVar22 = &local_38->dbuf;
      dbuf_putc(pDVar22,'\x12');
      dbuf_put_leb128(pDVar22,*puVar12);
      bc_put_u64(pBVar21,*(uint64_t *)(puVar12 + 2));
      iVar8 = js_resize_array(pBVar21->ctx,&pBVar21->sab_tab,8,&pBVar21->sab_tab_size,
                              pBVar21->sab_tab_len + 1);
      iVar10 = -1;
      if (iVar8 == 0) {
        puVar11 = *(uint8_t **)(puVar12 + 2);
        iVar10 = pBVar21->sab_tab_len;
        pBVar21->sab_tab_len = iVar10 + 1;
        pBVar21->sab_tab[iVar10] = puVar11;
        goto LAB_00126374;
      }
    }
LAB_0012632e:
    *(byte *)((long)JVar18.ptr + 5) = *(byte *)((long)JVar18.ptr + 5) & 0xbf;
LAB_00126332:
    if (iVar10 != 0) {
      return -1;
    }
    return 0;
  }
  dbuf_putc(&s->dbuf,uVar16);
  return 0;
switchD_001259a6_caseD_fffffffa:
  JS_ThrowInternalError(pJVar20,"unsupported tag (%d)",JVar28.tag & 0xffffffff);
  return -1;
}

Assistant:

static int JS_WriteObjectRec(BCWriterState *s, JSValueConst obj)
{
    uint32_t tag;

    if (js_check_stack_overflow(s->ctx->rt, 0)) {
        JS_ThrowStackOverflow(s->ctx);
        return -1;
    }

    tag = JS_VALUE_GET_NORM_TAG(obj);
    switch(tag) {
    case JS_TAG_NULL:
        bc_put_u8(s, BC_TAG_NULL);
        break;
    case JS_TAG_UNDEFINED:
        bc_put_u8(s, BC_TAG_UNDEFINED);
        break;
    case JS_TAG_BOOL:
        bc_put_u8(s, BC_TAG_BOOL_FALSE + JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_INT:
        bc_put_u8(s, BC_TAG_INT32);
        bc_put_sleb128(s, JS_VALUE_GET_INT(obj));
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            bc_put_u8(s, BC_TAG_FLOAT64);
            u.d = JS_VALUE_GET_FLOAT64(obj);
            bc_put_u64(s, u.u64);
        }
        break;
    case JS_TAG_STRING:
        {
            JSString *p = JS_VALUE_GET_STRING(obj);
            bc_put_u8(s, BC_TAG_STRING);
            JS_WriteString(s, p);
        }
        break;
    case JS_TAG_FUNCTION_BYTECODE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteFunctionTag(s, obj))
            goto fail;
        break;
    case JS_TAG_MODULE:
        if (!s->allow_bytecode)
            goto invalid_tag;
        if (JS_WriteModule(s, obj))
            goto fail;
        break;
    case JS_TAG_OBJECT:
        {
            JSObject *p = JS_VALUE_GET_OBJ(obj);
            int ret, idx;
            
            if (s->allow_reference) {
                idx = js_object_list_find(s->ctx, &s->object_list, p);
                if (idx >= 0) {
                    bc_put_u8(s, BC_TAG_OBJECT_REFERENCE);
                    bc_put_leb128(s, idx);
                    break;
                } else {
                    if (js_object_list_add(s->ctx, &s->object_list, p))
                        goto fail;
                }
            } else {
                if (p->tmp_mark) {
                    JS_ThrowTypeError(s->ctx, "circular reference");
                    goto fail;
                }
                p->tmp_mark = 1;
            }
            switch(p->class_id) {
            case JS_CLASS_ARRAY:
                ret = JS_WriteArray(s, obj);
                break;
            case JS_CLASS_OBJECT:
                ret = JS_WriteObjectTag(s, obj);
                break;
            case JS_CLASS_ARRAY_BUFFER:
                ret = JS_WriteArrayBuffer(s, obj);
                break;
            case JS_CLASS_SHARED_ARRAY_BUFFER:
                if (!s->allow_sab)
                    goto invalid_tag;
                ret = JS_WriteSharedArrayBuffer(s, obj);
                break;
            case JS_CLASS_DATE:
                bc_put_u8(s, BC_TAG_DATE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            case JS_CLASS_NUMBER:
            case JS_CLASS_STRING:
            case JS_CLASS_BOOLEAN:
#ifdef CONFIG_BIGNUM
            case JS_CLASS_BIG_INT:
            case JS_CLASS_BIG_FLOAT:
            case JS_CLASS_BIG_DECIMAL:
#endif
                bc_put_u8(s, BC_TAG_OBJECT_VALUE);
                ret = JS_WriteObjectRec(s, p->u.object_data);
                break;
            default:
                if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                    p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
                    ret = JS_WriteTypedArray(s, obj);
                } else {
                    JS_ThrowTypeError(s->ctx, "unsupported object class");
                    ret = -1;
                }
                break;
            }
            p->tmp_mark = 0;
            if (ret)
                goto fail;
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
    case JS_TAG_BIG_FLOAT:
    case JS_TAG_BIG_DECIMAL:
        if (JS_WriteBigNum(s, obj))
            goto fail;
        break;
#endif
    default:
    invalid_tag:
        JS_ThrowInternalError(s->ctx, "unsupported tag (%d)", tag);
        goto fail;
    }
    return 0;

 fail:
    return -1;
}